

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-type.cpp
# Opt level: O3

void __thiscall wasm::anon_unknown_0::TypeInfo::TypeInfo(TypeInfo *this,TypeInfo *other)

{
  Kind KVar1;
  pointer pTVar2;
  
  this->isTemp = false;
  KVar1 = other->kind;
  this->kind = KVar1;
  if (KVar1 == RefKind) {
    pTVar2 = (other->field_2).tuple.types.
             super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
             super__Vector_impl_data._M_finish;
    (this->field_2).tuple.types.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
    super__Vector_impl_data._M_start =
         (other->field_2).tuple.types.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>.
         _M_impl.super__Vector_impl_data._M_start;
    (this->field_2).tuple.types.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
    super__Vector_impl_data._M_finish = pTVar2;
    return;
  }
  if (KVar1 == TupleKind) {
    std::vector<wasm::Type,_std::allocator<wasm::Type>_>::vector
              (&(this->field_2).tuple.types,&(other->field_2).tuple.types);
    return;
  }
  handle_unreachable("unexpected kind",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm/wasm-type.cpp"
                     ,0x231);
}

Assistant:

TypeInfo::TypeInfo(const TypeInfo& other) {
  kind = other.kind;
  switch (kind) {
    case TupleKind:
      new (&tuple) auto(other.tuple);
      return;
    case RefKind:
      new (&ref) auto(other.ref);
      return;
  }
  WASM_UNREACHABLE("unexpected kind");
}